

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O2

void mg_template(mg_connection *conn,char *s,mg_expansion *expansions)

{
  char *__s;
  bool bVar1;
  int iVar2;
  long lVar3;
  size_t sVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  _func_void_mg_connection_ptr **pp_Var10;
  
  lVar9 = 0;
  iVar5 = 0;
  bVar1 = false;
  do {
    lVar3 = (long)iVar5;
    iVar7 = (int)lVar9;
    if (s[lVar9] == '\0') {
      if (iVar7 - iVar5 == 0 || iVar7 < iVar5) {
        return;
      }
      mg_send_data(conn,s + lVar3,iVar7 - iVar5);
      return;
    }
    iVar6 = iVar5;
    if (bVar1) {
LAB_00106168:
      iVar5 = iVar6;
      if (*(short *)(s + lVar9) == 0x7d7d) {
        iVar8 = (iVar7 - iVar6) + -2;
        pp_Var10 = &expansions->handler;
        while( true ) {
          __s = ((mg_expansion *)(pp_Var10 + -1))->keyword;
          bVar1 = false;
          if (__s == (char *)0x0) break;
          sVar4 = strlen(__s);
          if ((iVar8 == (int)sVar4) &&
             (iVar2 = bcmp(__s,s + (long)iVar6 + 2,(long)iVar8), iVar2 == 0)) {
            (**pp_Var10)(conn);
            iVar5 = iVar7 + 2;
            break;
          }
          pp_Var10 = pp_Var10 + 2;
        }
      }
      else {
        bVar1 = true;
      }
    }
    else {
      bVar1 = false;
      if (*(short *)(s + lVar9) == 0x7b7b) {
        iVar6 = iVar7;
        if (lVar3 < lVar9) {
          mg_send_data(conn,s + lVar3,iVar7 - iVar5);
        }
        goto LAB_00106168;
      }
    }
    lVar9 = lVar9 + 1;
  } while( true );
}

Assistant:

void mg_template(struct mg_connection *conn, const char *s,
                 struct mg_expansion *expansions) {
  int i, j, pos = 0, inside_marker = 0;

  for (i = 0; s[i] != '\0'; i++) {
    if (inside_marker == 0 && !memcmp(&s[i], "{{", 2)) {
      if (i > pos) {
        mg_send_data(conn, &s[pos], i - pos);
      }
      pos = i;
      inside_marker = 1;
    }
    if (inside_marker == 1 && !memcmp(&s[i], "}}", 2)) {
      for (j = 0; expansions[j].keyword != NULL; j++) {
        const char *kw = expansions[j].keyword;
        if ((int) strlen(kw) == i - (pos + 2) &&
            memcmp(kw, &s[pos + 2], i - (pos + 2)) == 0) {
          expansions[j].handler(conn);
          pos = i + 2;
          break;
        }
      }
      inside_marker = 0;
    }
  }
  if (i > pos) {
    mg_send_data(conn, &s[pos], i - pos);
  }
}